

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::BlockMultiBasicTypesCase::init
          (BlockMultiBasicTypesCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_> *pvVar1;
  ShaderInterface *this_00;
  int iVar2;
  UniformBlock *pUVar3;
  UniformBlock *pUVar4;
  VarType local_80;
  Uniform local_68;
  
  this_00 = &(this->super_UniformBlockCase).m_interface;
  pUVar3 = deqp::gls::ub::ShaderInterface::allocBlock(this_00,"BlockA");
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_FLOAT,4);
  deqp::gls::ub::Uniform::Uniform(&local_68,"a",&local_80,0);
  pvVar1 = &pUVar3->m_uniforms;
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_UINT_VEC3,1);
  deqp::gls::ub::Uniform::Uniform(&local_68,"b",&local_80,0xc00);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_FLOAT_MAT2,2);
  deqp::gls::ub::Uniform::Uniform(&local_68,"c",&local_80,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  std::__cxx11::string::assign((char *)&pUVar3->m_instanceName);
  pUVar3->m_flags = this->m_flagsA;
  pUVar4 = deqp::gls::ub::ShaderInterface::allocBlock(this_00,"BlockB");
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::Uniform::Uniform(&local_68,"a",&local_80,0);
  pvVar1 = &pUVar4->m_uniforms;
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_INT_VEC2,1);
  deqp::gls::ub::Uniform::Uniform(&local_68,"b",&local_80,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::Uniform::Uniform(&local_68,"c",&local_80,0xc00);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_BOOL,0);
  deqp::gls::ub::Uniform::Uniform(&local_68,"d",&local_80,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  std::__cxx11::string::assign((char *)&pUVar4->m_instanceName);
  pUVar4->m_flags = this->m_flagsB;
  iVar2 = this->m_numInstances;
  if (0 < iVar2) {
    pUVar3->m_arraySize = iVar2;
    pUVar4->m_arraySize = iVar2;
  }
  return iVar2;
}

Assistant:

void init (void)
	{
		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}